

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KryoFlux.cpp
# Opt level: O0

int __thiscall KryoFlux::GetInfo(KryoFlux *this,int index,string *info)

{
  string *psVar1;
  int iVar2;
  string local_40 [4];
  int ret;
  string *local_20;
  string *info_local;
  KryoFlux *pKStack_10;
  int index_local;
  KryoFlux *this_local;
  
  local_20 = info;
  info_local._4_4_ = index;
  pKStack_10 = this;
  (**(code **)(*(long *)this + 0x18))(local_40,this,0x81,index,0);
  std::__cxx11::string::operator=((string *)local_20,local_40);
  std::__cxx11::string::~string(local_40);
  iVar2 = ResponseCode(local_20);
  psVar1 = local_20;
  std::__cxx11::string::find((char)local_20,0x20);
  std::__cxx11::string::erase((ulong)psVar1,0);
  psVar1 = local_20;
  std::__cxx11::string::find((char)local_20,0x20);
  std::__cxx11::string::erase((ulong)psVar1,0);
  return iVar2;
}

Assistant:

int KryoFlux::GetInfo(int index, std::string& info)
{
    info = Control(REQ_INFO | REQ_GET, index);
    auto ret = ResponseCode(info);
    info.erase(0, info.find(' ') + 1);  // remove time code
    info.erase(0, info.find(' ') + 1);  // remove info response
    return ret;
}